

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderTextureSizeTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureSizeCase::iterate(TextureSizeCase *this)

{
  ostringstream *poVar1;
  TextureType TVar2;
  uint uVar3;
  RenderContext *context;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 extraout_var;
  ulong uVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  RenderTarget *pRVar12;
  ostream *poVar13;
  char *description;
  uint uVar14;
  IterateResult IVar15;
  qpTestResult testResult;
  int iVar16;
  pointer pVVar17;
  Surface result;
  Surface local_350;
  TextureFormat local_338;
  undefined1 local_330 [120];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar10;
  
  tcu::Surface::Surface(&local_350,1,1);
  local_330._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_330 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\nIteration ",0xb);
  std::ostream::operator<<(poVar1,this->m_iteration + 1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
  std::ostream::operator<<
            (poVar1,(int)((ulong)((long)(this->m_iterations).
                                        super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_iterations).
                                       super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                    -0x55555555);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_2b8);
  pVVar17 = (this->m_iterations).
            super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>._M_impl.
            super__Vector_impl_data._M_start + this->m_iteration;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar4);
  if (this->m_isArrayType == false) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Creating texture with size ",0x1b);
    std::ostream::operator<<(poVar1,pVVar17->m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"x",1);
    std::ostream::operator<<(poVar1,pVVar17->m_data[1]);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Creating texture with size ",0x1b);
    std::ostream::operator<<(poVar1,pVVar17->m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"x",1);
    std::ostream::operator<<(poVar1,pVVar17->m_data[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"x",1);
    std::ostream::operator<<(poVar1,pVVar17->m_data[2]);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  (**(code **)(lVar10 + 0x6f8))(1);
  uVar8 = 0;
  if ((ulong)this->m_type < 6) {
    uVar8 = *(undefined4 *)(&DAT_01ca0fcc + (ulong)this->m_type * 4);
  }
  (**(code **)(lVar10 + 0xb8))(uVar8,this->m_texture);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"texture gen",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x195);
  TVar2 = this->m_type;
  uVar11 = (ulong)TVar2;
  if (this->m_isArrayType == false) {
    uVar7 = 0;
    uVar8 = 0;
    if (TVar2 < TEXTURE_LAST) {
      uVar8 = *(undefined4 *)(&DAT_01ca0fcc + uVar11 * 4);
    }
    if (TVar2 < TEXTURE_LAST) {
      uVar7 = *(undefined4 *)(&DAT_01ca0fb4 + uVar11 * 4);
    }
    (**(code **)(lVar10 + 0x1390))
              (uVar8,this->m_numSamples,uVar7,pVVar17->m_data[0],pVVar17->m_data[1],0);
  }
  else {
    uVar7 = 0;
    uVar8 = 0;
    if (TVar2 < TEXTURE_LAST) {
      uVar8 = *(undefined4 *)(&DAT_01ca0fcc + uVar11 * 4);
    }
    if (TVar2 < TEXTURE_LAST) {
      uVar7 = *(undefined4 *)(&DAT_01ca0fb4 + uVar11 * 4);
    }
    (**(code **)(lVar10 + 0x13a8))
              (uVar8,this->m_numSamples,uVar7,pVVar17->m_data[0],pVVar17->m_data[1],
               pVVar17->m_data[2],0);
  }
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"texStorage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x19b);
  iVar4 = this->m_iteration;
  pVVar17 = (this->m_iterations).
            super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var_00,iVar6);
  uVar7 = (**(code **)(lVar10 + 0x780))((this->m_shader->m_program).m_program,"a_position");
  uVar8 = (**(code **)(lVar10 + 0xb48))((this->m_shader->m_program).m_program,"u_sampler");
  uVar9 = (**(code **)(lVar10 + 0xb48))((this->m_shader->m_program).m_program,"u_size");
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Running the verification shader.",0x20);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"preclear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1b4);
  (**(code **)(lVar10 + 0x1a00))(0,0,1,1);
  (**(code **)(lVar10 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar10 + 0x188))(0x4000);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1b8);
  (**(code **)(lVar10 + 0x40))(0x8892,this->m_vbo);
  (**(code **)(lVar10 + 0x19f0))(uVar7,4,0x1406,0,0,0);
  (**(code **)(lVar10 + 0x610))(uVar7);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"vertexAttrib",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1bd);
  (**(code **)(lVar10 + 0x1680))((this->m_shader->m_program).m_program);
  (**(code **)(lVar10 + 0x14f0))(uVar8,0);
  (**(code **)(lVar10 + 0x1538 + (ulong)this->m_isArrayType * 0x40))(uVar9,1,pVVar17 + iVar4);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"setup program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1c5);
  uVar8 = 0;
  if ((ulong)this->m_type < 6) {
    uVar8 = *(undefined4 *)(&DAT_01ca0fcc + (ulong)this->m_type * 4);
  }
  (**(code **)(lVar10 + 0xb8))(uVar8,this->m_texture);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"bindtex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1c8);
  (**(code **)(lVar10 + 0x538))(5,0,4);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"drawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1cb);
  (**(code **)(lVar10 + 0x518))(uVar7);
  (**(code **)(lVar10 + 0x1680))(0);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"cleanup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1cf);
  (**(code **)(lVar10 + 0x648))();
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_338.order = RGBA;
  local_338.type = UNORM_INT8;
  if ((uint *)local_350.m_pixels.m_cap != (uint *)0x0) {
    local_350.m_pixels.m_cap = (size_t)local_350.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,&local_338,local_350.m_width,local_350.m_height,1,
             (void *)local_350.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"readPixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1d3);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_texture != 0) {
    (**(code **)(CONCAT44(extraout_var_01,iVar4) + 0x480))(1,&this->m_texture);
    this->m_texture = 0;
    dVar5 = (**(code **)(CONCAT44(extraout_var_01,iVar4) + 0x800))();
    glu::checkError(dVar5,"texture delete",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                    ,0x1a7);
  }
  this->m_allCasesSkipped = false;
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = 1 << (8U - (char)(pRVar12->m_pixelFormat).redBits & 0x1f);
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar16 = 1 << (8U - (char)(pRVar12->m_pixelFormat).greenBits & 0x1f);
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar6 = 1 << (8U - (char)(pRVar12->m_pixelFormat).blueBits & 0x1f);
  uVar3 = *local_350.m_pixels.m_ptr;
  local_330._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_330 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Verifying image.",0x10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_2b8);
  uVar14 = uVar3 & 0xff;
  if ((((int)uVar14 < iVar4) && (0xff - iVar16 < (int)(uVar3 >> 8 & 0xff))) &&
     ((int)(uVar3 >> 0x10 & 0xff) < iVar6)) {
    local_330._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_330 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Result ok.",10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_2b8);
  }
  else {
    if (((0xff - iVar4 < (int)uVar14) && ((int)(uVar3 >> 8 & 0xff) < iVar16)) &&
       ((int)(uVar3 >> 0x10 & 0xff) < iVar6)) {
      local_330._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_330 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_330 + 8),"Image size incorrect.",0x15);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_330._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_330 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Expected either green or red pixel, got ",0x28);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"RGBA(",5);
      poVar13 = (ostream *)std::ostream::operator<<(poVar1,uVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar3 >> 8 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar3 >> 0x10 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar3 >> 0x18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_330 + 8));
    std::ios_base::~ios_base(local_2b8);
    this->m_allIterationsPassed = false;
  }
  iVar4 = this->m_iteration + 1;
  this->m_iteration = iVar4;
  iVar6 = (int)((ulong)((long)(this->m_iterations).
                              super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_iterations).
                             super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 2);
  IVar15 = CONTINUE;
  if (SBORROW4(iVar4,iVar6 * -0x55555555) != iVar4 + iVar6 * 0x55555555 < 0) goto LAB_014edaff;
  if (this->m_allIterationsPassed == false) {
    local_330._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_330 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"One or more test sizes failed.",0x1e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_2b8);
    description = "Got invalid texture size";
LAB_014eda8a:
    testResult = QP_TEST_RESULT_FAIL;
  }
  else {
    if (this->m_allCasesSkipped == true) {
      local_330._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_330 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Could not test any texture size, texture creation failed.",0x39)
      ;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_2b8);
      description = "All test texture creations failed";
      goto LAB_014eda8a;
    }
    local_330._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_330 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"All texture sizes passed.",0x19);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_2b8);
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  IVar15 = STOP;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
LAB_014edaff:
  tcu::Surface::~Surface(&local_350);
  return IVar15;
}

Assistant:

TextureSizeCase::IterateResult TextureSizeCase::iterate (void)
{
	tcu::Surface	result		(1, 1);
	bool			skipTest	= false;

	m_testCtx.getLog() << tcu::TestLog::Message << "\nIteration " << (m_iteration+1) << " / " << (int)m_iterations.size() << tcu::TestLog::EndMessage;

	try
	{
		// set texture size

		createTexture(m_iterations[m_iteration]);

		// query texture size

		runShader(result, m_iterations[m_iteration]);
	}
	catch (glu::OutOfMemoryError&)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Got GL_OUT_OF_MEMORY, skipping this size" << tcu::TestLog::EndMessage;

		skipTest = true;
	}

	// free resources

	deleteTexture();

	// queried value was correct?

	if (!skipTest)
	{
		m_allCasesSkipped = false;

		if (!verifyImage(result))
			m_allIterationsPassed = false;
	}

	// final result

	if (++m_iteration < (int)m_iterations.size())
		return CONTINUE;

	if (!m_allIterationsPassed)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "One or more test sizes failed." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid texture size");
	}
	else if (m_allCasesSkipped)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Could not test any texture size, texture creation failed." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "All test texture creations failed");
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "All texture sizes passed." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return STOP;
}